

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElasticityCosserat::ComputeStiffnessMatrix
          (ChElasticityCosserat *this,ChMatrixNM<double,_6,_6> *K,ChVector<double> *strain_e,
          ChVector<double> *strain_k)

{
  double *pdVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  ChVector<double> v;
  ChVector<double> bstress_m;
  ChVector<double> bstress_n;
  ChVector<double> strain_e_inc;
  ChVector<double> astress_m;
  ChVector<double> astress_n;
  ChVector<double> strain_k_inc;
  double local_f8 [4];
  double local_d8;
  double dStack_d0;
  double local_c8;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double local_a0 [7];
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  double local_40;
  double local_38;
  
  local_68 = 0.0;
  dStack_60 = 0.0;
  lVar4 = 0;
  local_58 = 0.0;
  local_a0[5] = 0.0;
  local_a0[3] = 0.0;
  local_a0[4] = 0.0;
  local_a8 = 0.0;
  local_b8 = 0.0;
  dStack_b0 = 0.0;
  local_c8 = 0.0;
  local_d8 = 0.0;
  dStack_d0 = 0.0;
  local_a0[0] = strain_e->m_data[0];
  local_a0[1] = strain_e->m_data[1];
  local_a0[2] = strain_e->m_data[2];
  local_48 = strain_k->m_data[0];
  local_40 = strain_k->m_data[1];
  local_38 = strain_k->m_data[2];
  (*this->_vptr_ChElasticityCosserat[2])();
  pdVar3 = (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array
           + 0x12;
  do {
    local_a0[lVar4] = local_a0[lVar4] + 1e-06;
    (*this->_vptr_ChElasticityCosserat[2])(this,&local_b8,&local_d8,local_a0,&local_48);
    local_f8[0] = local_b8 - local_68;
    local_f8[1] = dStack_b0 - dStack_60;
    local_f8[2] = local_a8 - local_58;
    lVar2 = 0;
    pdVar1 = (double *)K;
    do {
      *pdVar1 = local_f8[lVar2] * 1000000.0;
      lVar2 = lVar2 + 1;
      pdVar1 = pdVar1 + 6;
    } while (lVar2 != 3);
    local_f8[0] = local_d8 - local_a0[3];
    local_f8[1] = dStack_d0 - local_a0[4];
    local_f8[2] = local_c8 - local_a0[5];
    lVar2 = 0;
    pdVar1 = pdVar3;
    do {
      *pdVar1 = local_f8[lVar2] * 1000000.0;
      lVar2 = lVar2 + 1;
      pdVar1 = pdVar1 + 6;
    } while (lVar2 != 3);
    local_a0[lVar4] = local_a0[lVar4] + -1e-06;
    lVar4 = lVar4 + 1;
    K = (ChMatrixNM<double,_6,_6> *)((long)K + 8);
    pdVar3 = pdVar3 + 1;
  } while (lVar4 != 3);
  local_48 = local_48 + 1e-06;
  (*this->_vptr_ChElasticityCosserat[2])(this,&local_b8,&local_d8,local_a0);
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, 6, 6, 1>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, 6, 6, 1>>]"
               );
}

Assistant:

void ChElasticityCosserat::ComputeStiffnessMatrix(ChMatrixNM<double, 6, 6>& K,
                                                  const ChVector<>& strain_e,
                                                  const ChVector<>& strain_k) {
    double epsi = 1e-6;
    double invepsi = 1.0 / epsi;
    ChVector<> astress_n;
    ChVector<> astress_m;
    ChVector<> bstress_n;
    ChVector<> bstress_m;
    ChVector<> strain_e_inc = strain_e;
    ChVector<> strain_k_inc = strain_k;
    this->ComputeStress(astress_n, astress_m, strain_e, strain_k);
    for (int i = 0; i < 3; ++i) {
        strain_e_inc[i] += epsi;
        this->ComputeStress(bstress_n, bstress_m, strain_e_inc, strain_k_inc);
        K.block(0, i, 3, 1) = (bstress_n - astress_n).eigen() * invepsi;
        K.block(3, i, 3, 1) = (bstress_m - astress_m).eigen() * invepsi;
        strain_e_inc[i] -= epsi;
    }
    for (int i = 0; i < 3; ++i) {
        strain_k_inc[i] += epsi;
        this->ComputeStress(bstress_n, bstress_m, strain_e_inc, strain_k_inc);
        K.block(0, i + 3, 3, 3) = (bstress_n - astress_n).eigen() * invepsi;
        K.block(3, i + 3, 3, 3) = (bstress_m - astress_m).eigen() * invepsi;
        strain_k_inc[i] -= epsi;
    }
}